

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::Psbt::CreateRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,string *prefix,uint8_t sub_type,
          string *sub_key)

{
  uint8_t sub_type_00;
  uint8_t *puVar1;
  char *pcVar2;
  size_t sVar3;
  ByteData local_60;
  ByteData local_48;
  string *local_30;
  string *sub_key_local;
  string *psStack_20;
  uint8_t sub_type_local;
  string *prefix_local;
  ByteData *pBStack_10;
  uint8_t type_local;
  
  local_30 = sub_key;
  sub_key_local._7_1_ = sub_type;
  psStack_20 = prefix;
  prefix_local._7_1_ = type;
  pBStack_10 = __return_storage_ptr__;
  puVar1 = (uint8_t *)::std::__cxx11::string::data();
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  sVar3 = strlen(pcVar2);
  ByteData::ByteData(&local_48,puVar1,(uint32_t)sVar3);
  sub_type_00 = sub_key_local._7_1_;
  puVar1 = (uint8_t *)::std::__cxx11::string::data();
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  sVar3 = strlen(pcVar2);
  ByteData::ByteData(&local_60,puVar1,(uint32_t)sVar3);
  CreateRecordKey(__return_storage_ptr__,type,&local_48,sub_type_00,&local_60);
  ByteData::~ByteData((ByteData *)0x46ee6c);
  ByteData::~ByteData((ByteData *)0x46ee75);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(
    uint8_t type, const std::string &prefix, uint8_t sub_type,
    const std::string &sub_key) {
  return CreateRecordKey(
      type,
      ByteData(
          reinterpret_cast<const uint8_t *>(prefix.data()),
          static_cast<uint32_t>(strlen(prefix.c_str()))),
      sub_type,
      ByteData(
          reinterpret_cast<const uint8_t *>(sub_key.data()),
          static_cast<uint32_t>(strlen(sub_key.c_str()))));
}